

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double expected_sd_cat_internal<double,unsigned_long,double>
                 (int ncat,double *buffer_cnt,double cnt_l,unsigned_long *buffer_pos,
                 double *buffer_prob)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  uint uVar5;
  double dVar6;
  
  uVar4 = 0;
  for (lVar1 = (long)ncat << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    buffer_pos[uVar4] = uVar4;
    uVar4 = uVar4 + 1;
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)ncat;
  if (ncat < 1) {
    uVar3 = uVar2;
  }
  lVar1 = 0;
  uVar5 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar6 = buffer_cnt[uVar2];
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      uVar5 = uVar5 + 1;
      buffer_prob[uVar2] = dVar6 / cnt_l;
    }
    else {
      uVar4 = buffer_pos[lVar1];
      buffer_pos[lVar1] = buffer_pos[uVar2];
      buffer_pos[uVar2] = uVar4;
      lVar1 = lVar1 + 1;
    }
  }
  if ((int)uVar5 < 2) {
    return 0.0;
  }
  dVar6 = expected_sd_cat<unsigned_long,double>(buffer_prob,(ulong)uVar5,buffer_pos + lVar1);
  return dVar6;
}

Assistant:

double expected_sd_cat_internal(int ncat, number *restrict buffer_cnt, ldouble_safe cnt_l,
                                int_t *restrict buffer_pos, double *restrict buffer_prob)
{
    /* move zero-valued to the beginning */
    std::iota(buffer_pos, buffer_pos + ncat, (int_t)0);
    int_t st_pos = 0;
    int ncat_present = 0;
    int_t temp;
    for (int cat = 0; cat < ncat; cat++)
    {
        if (buffer_cnt[cat])
        {
            ncat_present++;
            buffer_prob[cat] = (ldouble_safe) buffer_cnt[cat] / cnt_l;
        }

        else
        {
            temp = buffer_pos[st_pos];
            buffer_pos[st_pos] = buffer_pos[cat];
            buffer_pos[cat] = temp;
            st_pos++;
        }
    }

    if (ncat_present <= 1) return 0;
    return expected_sd_cat<int_t, ldouble_safe>(buffer_prob, ncat_present, buffer_pos + st_pos);
}